

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O0

Gia_Man_t * Gia_ManAigSynch2(Gia_Man_t *pInit,void *pPars0,int nLutSize,int nRelaxRatio)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *pGVar4;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  int fVerbose;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *pGia3;
  Gia_Man_t *pGia2;
  Gia_Man_t *pGia1;
  Dch_Pars_t *pParsDch;
  int nRelaxRatio_local;
  int nLutSize_local;
  void *pPars0_local;
  Gia_Man_t *pInit_local;
  
  Pars.pTimesReq._4_4_ = *(int *)((long)pPars0 + 0x2c);
  Lf_ManSetDefaultPars((Jf_Par_t *)&pPars);
  Pars.fPower = 1;
  Pars.fUseMux7 = 1;
  Pars.nRelaxRatio = 5;
  pPars._4_4_ = 0xc;
  Pars.fCutSimple = Pars.pTimesReq._4_4_;
  Pars.nRounds = nRelaxRatio;
  if (Pars.pTimesReq._4_4_ != 0) {
    Gia_ManPrintStats(pInit,(Gps_Par_t *)0x0);
  }
  pInit_local = Gia_ManDup(pInit);
  iVar1 = Gia_ManAndNum(pInit_local);
  if (iVar1 == 0) {
    Gia_ManTransferTiming(pInit_local,pInit);
  }
  else {
    if ((pInit_local->pManTime != (void *)0x0) && (pInit_local->vLevels == (Vec_Int_t *)0x0)) {
      Gia_ManLevelWithBoxes(pInit_local);
    }
    iVar1 = Gia_ManHasMapping(pInit);
    pGia2 = pInit_local;
    if (iVar1 != 0) {
      Gia_ManTransferMapping(pInit_local,pInit);
      pGia2 = (Gia_Man_t *)Dsm_ManDeriveGia(pInit_local,0);
      Gia_ManStop(pInit_local);
    }
    Gia_ManBufNum(pGia2);
    pGVar4 = Gia_ManAreaBalance(pGia2,0,1000000000,0,0);
    if (Pars.pTimesReq._4_4_ != 0) {
      Gia_ManPrintStats(pGVar4,(Gps_Par_t *)0x0);
    }
    pGVar3 = Lf_ManPerformMapping(pGVar4,(Jf_Par_t *)&pPars);
    if (Pars.pTimesReq._4_4_ != 0) {
      Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
    }
    if (pGVar4 != pGVar3) {
      Gia_ManStop(pGVar4);
    }
    if ((*(int *)((long)pPars0 + 0x24) == 0) && (iVar1 = Gia_ManBufNum(pGVar3), iVar1 == 0)) {
      iVar1 = Gia_ManBufNum(pGVar3);
      if (iVar1 != 0) {
        __assert_fail("Gia_ManBufNum(pGia2) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x1b4,"Gia_Man_t *Gia_ManAigSynch2(Gia_Man_t *, void *, int, int)");
      }
      pGia3 = Gia_ManAreaBalance(pGVar3,0,1000000000,0,0);
      if (Pars.pTimesReq._4_4_ != 0) {
        Gia_ManPrintStats(pGia3,(Gps_Par_t *)0x0);
      }
      Gia_ManStop(pGVar3);
      pNew = Gia_ManPerformDsdBalance(pGia3,6,8,0,0);
    }
    else {
      pNew = Gia_ManAreaBalance(pGVar3,0,1000000000,0,0);
      pGia3 = pGVar3;
    }
    if (Pars.pTimesReq._4_4_ != 0) {
      Gia_ManPrintStats(pNew,(Gps_Par_t *)0x0);
    }
    iVar1 = Gia_ManBufNum(pInit);
    if (iVar1 != 0) {
      iVar1 = Gia_ManBufNum(pInit);
      iVar2 = Gia_ManBufNum(pGia2);
      if (iVar1 != iVar2) {
        __assert_fail("Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x1bf,"Gia_Man_t *Gia_ManAigSynch2(Gia_Man_t *, void *, int, int)");
      }
      pGVar4 = Gia_ManDupFromBarBufs(pGia2);
      Gia_ManStop(pGia2);
      iVar1 = Gia_ManBufNum(pInit);
      iVar2 = Gia_ManBufNum(pGia3);
      if (iVar1 != iVar2) {
        __assert_fail("Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x1c2,"Gia_Man_t *Gia_ManAigSynch2(Gia_Man_t *, void *, int, int)");
      }
      pGVar3 = Gia_ManDupFromBarBufs(pGia3);
      Gia_ManStop(pGia3);
      iVar1 = Gia_ManBufNum(pInit);
      iVar2 = Gia_ManBufNum(pNew);
      if (iVar1 != iVar2) {
        __assert_fail("Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia3)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                      ,0x1c5,"Gia_Man_t *Gia_ManAigSynch2(Gia_Man_t *, void *, int, int)");
      }
      pGVar5 = Gia_ManDupFromBarBufs(pNew);
      Gia_ManStop(pNew);
      pNew = pGVar5;
      pGia3 = pGVar3;
      pGia2 = pGVar4;
    }
    pGVar4 = Gia_ManAigSynch2Choices(pGia2,pGia3,pNew,(Dch_Pars_t *)pPars0);
    Gia_ManStop(pGia2);
    Gia_ManStop(pGia3);
    Gia_ManStop(pNew);
    iVar1 = Gia_ManBufNum(pInit);
    pTemp = pGVar4;
    if (iVar1 != 0) {
      iVar1 = Gia_ManBufNum(pInit);
      pTemp = Gia_ManDupToBarBufs(pGVar4,iVar1);
      Gia_ManStop(pGVar4);
    }
    if (pTemp->pName != (char *)0x0) {
      free(pTemp->pName);
      pTemp->pName = (char *)0x0;
    }
    if (pTemp->pSpec != (char *)0x0) {
      free(pTemp->pSpec);
      pTemp->pSpec = (char *)0x0;
    }
    pcVar6 = Abc_UtilStrsav(pInit->pName);
    pTemp->pName = pcVar6;
    pcVar6 = Abc_UtilStrsav(pInit->pSpec);
    pTemp->pSpec = pcVar6;
    Gia_ManTransferTiming(pTemp,pInit);
    pInit_local = pTemp;
  }
  return pInit_local;
}

Assistant:

Gia_Man_t * Gia_ManAigSynch2( Gia_Man_t * pInit, void * pPars0, int nLutSize, int nRelaxRatio )
{
    extern Gia_Man_t * Gia_ManLutBalance( Gia_Man_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose );
    Dch_Pars_t * pParsDch = (Dch_Pars_t *)pPars0;
    Gia_Man_t * pGia1, * pGia2, * pGia3, * pNew, * pTemp;
    int fVerbose = pParsDch->fVerbose;
    Jf_Par_t Pars, * pPars = &Pars;
    Lf_ManSetDefaultPars( pPars );
    pPars->fCutMin     = 1;
    pPars->fCoarsen    = 1;
    pPars->nRelaxRatio = nRelaxRatio;
    pPars->nAreaTuner  = 5;
    pPars->nCutNum     = 12;
    pPars->fVerbose    = fVerbose;
    if ( fVerbose )  Gia_ManPrintStats( pInit, NULL );
    pGia1 = Gia_ManDup( pInit );
    if ( Gia_ManAndNum(pGia1) == 0 )
    {
        Gia_ManTransferTiming( pGia1, pInit );
        return pGia1;
    }
    if ( pGia1->pManTime && pGia1->vLevels == NULL )
        Gia_ManLevelWithBoxes( pGia1 );
    // unmap if mapped
    if ( Gia_ManHasMapping(pInit) )
    {
        Gia_ManTransferMapping( pGia1, pInit );
        pGia1 = (Gia_Man_t *)Dsm_ManDeriveGia( pTemp = pGia1, 0 );
        Gia_ManStop( pTemp );
    }
    // perform balancing
    if ( Gia_ManBufNum(pGia1) || 1 )
        pGia2 = Gia_ManAreaBalance( pGia1, 0, ABC_INFINITY, 0, 0 );
    else
    {
        pGia2 = Gia_ManLutBalance( pGia1, nLutSize, 1, 1, 1, 0 );
        pGia2 = Gia_ManAreaBalance( pTemp = pGia2, 0, ABC_INFINITY, 0, 0 );
        Gia_ManStop( pTemp );
    }
    if ( fVerbose )     Gia_ManPrintStats( pGia2, NULL );
    // perform mapping
    pGia2 = Lf_ManPerformMapping( pTemp = pGia2, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pGia2, NULL );
    if ( pTemp != pGia2 )
        Gia_ManStop( pTemp );
    // perform balancing
    if ( pParsDch->fLightSynth || Gia_ManBufNum(pGia2) )
        pGia3 = Gia_ManAreaBalance( pGia2, 0, ABC_INFINITY, 0, 0 );
    else
    {
        assert( Gia_ManBufNum(pGia2) == 0 );
        pGia2 = Gia_ManAreaBalance( pTemp = pGia2, 0, ABC_INFINITY, 0, 0 );
        if ( fVerbose )     Gia_ManPrintStats( pGia2, NULL );
        Gia_ManStop( pTemp );
        // perform DSD balancing
        pGia3 = Gia_ManPerformDsdBalance( pGia2, 6, 8, 0, 0 );
    }
    if ( fVerbose )     Gia_ManPrintStats( pGia3, NULL );
    // perform choice computation
    if ( Gia_ManBufNum(pInit) )
    {
        assert( Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia1) );
        pGia1 = Gia_ManDupFromBarBufs( pTemp = pGia1 );
        Gia_ManStop( pTemp );
        assert( Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia2) );
        pGia2 = Gia_ManDupFromBarBufs( pTemp = pGia2 );
        Gia_ManStop( pTemp );
        assert( Gia_ManBufNum(pInit) == Gia_ManBufNum(pGia3) );
        pGia3 = Gia_ManDupFromBarBufs( pTemp = pGia3 );
        Gia_ManStop( pTemp );
    }
    pNew = Gia_ManAigSynch2Choices( pGia1, pGia2, pGia3, pParsDch );
    Gia_ManStop( pGia1 );
    Gia_ManStop( pGia2 );
    Gia_ManStop( pGia3 );
    if ( Gia_ManBufNum(pInit) )
    {
        pNew = Gia_ManDupToBarBufs( pTemp = pNew, Gia_ManBufNum(pInit) );
        Gia_ManStop( pTemp );
    }
    // copy names
    ABC_FREE( pNew->pName );
    ABC_FREE( pNew->pSpec );
    pNew->pName = Abc_UtilStrsav(pInit->pName);
    pNew->pSpec = Abc_UtilStrsav(pInit->pSpec);
    Gia_ManTransferTiming( pNew, pInit );
    return pNew;
}